

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool __thiscall IR::Instr::IsNeq(Instr *this)

{
  OpCode OVar1;
  Instr *this_local;
  
  OVar1 = this->m_opcode;
  if (((((OVar1 == BrNeq_A) || (OVar1 == BrSrNeq_A)) || (OVar1 == CmNeq_A)) ||
      ((OVar1 == CmSrNeq_A || (OVar1 == BrNotEq_A)))) ||
     ((OVar1 == BrSrNotEq_A || ((OVar1 == BrNeq_I4 || (OVar1 == CmNeq_I4)))))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Instr::IsNeq()
{
    switch (m_opcode)
    {
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrNeq_I4:
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::CmNeq_A:
    case Js::OpCode::CmNeq_I4:
    case Js::OpCode::CmSrNeq_A:
        return true;
    default:
        return false;
    }
}